

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int server_handle_hello(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,
                       ptls_handshake_properties_t *properties)

{
  size_t *psVar1;
  uint *puVar2;
  byte bVar3;
  uint uVar4;
  ptls_hpke_cipher_suite_t *ppVar5;
  st_ptls_ech_create_opener_t *psVar6;
  st_ptls_aead_context_t *psVar7;
  st_ptls_on_client_hello_t *psVar8;
  ptls_hash_algorithm_t *ppVar9;
  ptls_key_exchange_algorithm_t *ppVar10;
  st_ptls_encrypt_ticket_t *psVar11;
  st_ptls_hash_context_t *psVar12;
  st_ptls_update_traffic_key_t *psVar13;
  undefined8 uVar14;
  ptls_iovec_t pVar15;
  ptls_iovec_t pVar16;
  ptls_iovec_t ikm;
  ptls_iovec_t ikm_00;
  undefined1 *puVar17;
  void *pvVar18;
  byte bVar19;
  bool bVar20;
  int iVar21;
  uint32_t uVar22;
  int iVar23;
  int iVar24;
  uint32_t uVar25;
  st_ptls_client_hello_t *ch;
  ptls_aead_context_t *ppVar26;
  size_t sVar27;
  size_t sVar28;
  ptls_key_schedule_t *ppVar29;
  ptls_key_exchange_algorithm_t **pppVar30;
  ulong uVar31;
  ulong uVar32;
  byte *pbVar33;
  long lVar34;
  byte bVar35;
  ulong uVar36;
  long lVar37;
  st_ptls_signature_algorithms_t *signature_algorithms;
  ushort uVar38;
  void *get_sni_arg;
  char *pcVar39;
  st_ptls_ech_t *psVar40;
  uint8_t *puVar41;
  undefined4 uVar42;
  size_t i;
  anon_struct_16_2_f7306ffc_for_server_certificate_types *end;
  ptls_iovec_t *ppVar43;
  ushort *puVar44;
  ptls_buffer_t *ppVar45;
  size_t sVar46;
  ptls_context_t *ppVar47;
  size_t sVar48;
  ushort *puVar49;
  ptls_key_exchange_algorithm_t **pppVar50;
  ushort *puVar51;
  byte *pbVar52;
  st_ptls_client_hello_t *psVar53;
  ptls_cipher_suite_t *preferred;
  ptls_key_exchange_algorithm_t *ppVar54;
  ptls_buffer_t *ppVar55;
  anon_struct_16_2_f7306ffc_for_server_certificate_types *paVar56;
  uint8_t *puVar57;
  anon_struct_168_2_32182ca3_for_identities *paVar58;
  size_t sVar59;
  size_t sVar60;
  byte *pbVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  size_t i_1;
  bool bVar64;
  ptls_iovec_t tbs;
  ptls_iovec_t raw_message;
  ptls_iovec_t message_00;
  ptls_iovec_t message_01;
  ptls_iovec_t raw_message_00;
  ptls_iovec_t x;
  ptls_iovec_t x_00;
  ushort *puStackY_c00;
  ptls_t *in_stack_fffffffffffff408;
  ptls_t *ppVar65;
  ushort *local_bb8;
  void *pvStack_bb0;
  ptls_buffer_t local_ba8;
  st_ptls_ech_t *local_b88;
  ptls_key_exchange_algorithm_t *local_b80;
  ptls_t *local_b78;
  ptls_key_schedule_t *local_b70;
  ptls_handshake_properties_t *local_b68;
  void *local_b60;
  uint8_t *local_b58;
  uint8_t *local_b50;
  uint local_b48;
  undefined4 uStack_b44;
  anon_struct_168_2_32182ca3_for_identities *local_b40;
  uint16_t ticket_csid;
  uint16_t ticket_key_exchange_id;
  undefined1 local_b34;
  undefined1 local_b33;
  uint8_t local_b32 [6];
  undefined1 local_b2c;
  undefined1 local_b2b;
  undefined1 local_b2a;
  undefined1 local_b29;
  st_ptls_ech_t *local_b28;
  st_ptls_ech_t *local_b20;
  ptls_iovec_t ecdh_secret;
  uint16_t group;
  undefined6 uStack_b06;
  size_t sStack_b00;
  long local_af0;
  st_ptls_ech_t *local_ae8;
  uint32_t age_add;
  undefined2 local_ad6;
  undefined2 local_ad4;
  undefined2 local_ad2;
  undefined2 local_ad0;
  undefined2 local_ace;
  undefined2 local_acc;
  undefined2 local_aca;
  undefined2 local_ac8;
  ushort local_ac6 [3];
  ushort local_ac0;
  ushort local_abe [3];
  ushort local_ab8 [4];
  ushort local_ab0;
  ushort local_aae [3];
  ushort local_aa8 [3];
  undefined2 local_aa2;
  ushort local_aa0 [3];
  undefined2 local_a9a;
  ptls_iovec_t pubkey;
  ptls_buffer_t local_a80;
  ptls_iovec_t ticket_ctx;
  uint64_t issue_at;
  char *local_a38;
  undefined8 uStack_a30;
  ptls_iovec_t ticket_negotiated_protocol;
  uint8_t sig [64];
  undefined1 local_990 [784];
  undefined1 local_680 [416];
  undefined1 local_4e0 [784];
  undefined1 local_1d0 [416];
  
  puVar41 = (uint8_t *)message.len;
  psVar40 = (st_ptls_ech_t *)message.base;
  local_ba8.off = 0;
  local_ba8.is_allocated = '\0';
  local_ba8.align_bits = '\0';
  local_ba8._26_6_ = 0;
  local_ba8.capacity = 0;
  local_bb8 = (ushort *)0x0;
  pvStack_bb0 = (void *)0x0;
  pubkey.base = (uint8_t *)0x0;
  pubkey.len = 0;
  ecdh_secret.base = (uint8_t *)0x0;
  ecdh_secret.len = 0;
  local_b70 = (ptls_key_schedule_t *)CONCAT44(local_b70._4_4_,tls->state);
  local_ba8.base = "";
  local_b68 = properties;
  ch = (st_ptls_client_hello_t *)malloc(0x4b0);
  local_ba8._24_8_ = local_ba8._24_8_ & 0xffffffffffff0000;
  local_ba8.capacity = 0;
  local_ba8.off = 0;
  if (ch == (st_ptls_client_hello_t *)0x0) {
    iVar21 = 0x201;
    goto LAB_00119ada;
  }
  memset(local_4e0,0,0x4b0);
  memcpy(local_1d0,&DAT_00121258,0x198);
  memcpy(ch,local_4e0,0x4b0);
  local_b88 = psVar40;
  iVar21 = decode_client_hello(tls->ctx,ch,&psVar40->field_0x4,
                               psVar40->inner_client_random + (long)(puVar41 + -0x20),local_b68,tls)
  ;
  if (iVar21 != 0) goto LAB_00119ada;
  iVar23 = (int)local_b70;
  psVar53 = (st_ptls_client_hello_t *)0x0;
  if ((int)local_b70 == 9) {
    psVar53 = (st_ptls_client_hello_t *)tls->client_random;
  }
  raw_message.len = (size_t)tls;
  raw_message.base = puVar41;
  local_b80 = (ptls_key_exchange_algorithm_t *)&psVar40->field_0x4;
  local_b50 = psVar40->inner_client_random + (long)(puVar41 + -0x20);
  iVar21 = check_client_hello_constraints
                     ((ptls_context_t *)ch,psVar53,(void *)0x0,(int)local_b88,raw_message,
                      in_stack_fffffffffffff408);
  if (iVar21 != 0) goto LAB_00119ada;
  iVar21 = 0x2f;
  local_b58 = puVar41;
  if (iVar23 == 9) {
    if ((tls->ech).aead != (ptls_aead_context_t *)0x0) {
      if ((ch->ech).payload.base == (uint8_t *)0x0) {
        iVar21 = 0x6d;
        goto LAB_00119ada;
      }
      if (((((ch->ech).config_id != (tls->ech).config_id) ||
           (ppVar5 = (tls->ech).cipher, (ch->ech).cipher_suite.kdf != (ppVar5->id).kdf)) ||
          ((ch->ech).cipher_suite.aead != (ppVar5->id).aead)) || ((ch->ech).enc.len != 0))
      goto LAB_00119ada;
    }
  }
  else {
    puVar41 = ch->random_bytes;
    uVar62 = *(undefined8 *)puVar41;
    uVar63 = *(undefined8 *)(puVar41 + 8);
    uVar14 = *(undefined8 *)(puVar41 + 0x18);
    *(undefined8 *)(tls->client_random + 0x10) = *(undefined8 *)(puVar41 + 0x10);
    *(undefined8 *)(tls->client_random + 0x18) = uVar14;
    *(undefined8 *)tls->client_random = uVar62;
    *(undefined8 *)(tls->client_random + 8) = uVar63;
    log_client_random(tls);
  }
  if ((ch->ech).payload.base == (uint8_t *)0x0) {
    if ((undefined1  [112])((undefined1  [112])tls->ech & (undefined1  [112])0x1) !=
        (undefined1  [112])0x0) {
      if (iVar23 != 9) {
        __assert_fail("is_second_flight",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                      ,0x1162,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      goto LAB_00119ada;
    }
  }
  else {
    if ((ch->ech).type != '\0') goto LAB_00119ada;
    iVar23 = (int)local_b70;
    if ((int)local_b70 != 9) {
      *(byte *)&tls->ech = *(byte *)&tls->ech | 1;
      psVar6 = (tls->ctx->ech).server.create_opener;
      if (psVar6 != (st_ptls_ech_create_opener_t *)0x0) {
        local_a38 = "tls ech";
        uStack_a30 = 8;
        pVar15.len = 8;
        pVar15.base = (uint8_t *)"tls ech";
        ppVar26 = (*psVar6->cb)(psVar6,&(tls->ech).kem,&(tls->ech).cipher,tls,(ch->ech).config_id,
                                (ch->ech).cipher_suite,(ch->ech).enc,pVar15);
        (tls->ech).aead = ppVar26;
        if (ppVar26 != (ptls_aead_context_t *)0x0) {
          (tls->ech).config_id = (ch->ech).config_id;
        }
      }
      uVar22 = ptls_log_point_maybe_active(&server_handle_hello::logpoint);
      if (uVar22 != 0) {
        uVar25 = ptls_log_conn_maybe_active
                           (&tls->log_state,(_func_char_ptr_void_ptr *)tls,get_sni_arg);
        if ((uVar25 & uVar22) != 0) {
          local_b48 = 0;
          do {
            ptls_log__do_write_start(&server_handle_hello::logpoint,1);
            ptls_log__do_push_element_unsigned64(",\"tls\":",7,(uint64_t)tls);
            ptls_log__do_push_element_bool
                      (",\"is_ech\":",10,(uint)((tls->ech).aead != (ptls_aead_context_t *)0x0));
            iVar21 = ptls_log__do_write_end
                               (&server_handle_hello::logpoint,&tls->log_state,ptls_get_server_name,
                                tls,local_b48);
            local_b48 = 1;
          } while (iVar21 != 0);
        }
      }
    }
    psVar7 = (tls->ech).aead;
    if (psVar7 != (st_ptls_aead_context_t *)0x0) {
      sVar28 = (ch->ech).payload.len;
      local_bb8 = (ushort *)malloc(sVar28 - psVar7->algo->tag_size);
      if (local_bb8 != (ushort *)0x0) {
        ppVar65 = (ptls_t *)(local_b58 + -4);
        pvStack_bb0 = malloc((size_t)ppVar65);
        ppVar54 = local_b80;
        if (pvStack_bb0 != (void *)0x0) {
          local_b48 = (uint)(iVar23 == 9);
          uStack_b44 = 0;
          local_b78 = ppVar65;
          local_b60 = pvStack_bb0;
          memcpy(pvStack_bb0,local_b80,(size_t)ppVar65);
          pvVar18 = local_b60;
          local_b40 = (anon_struct_168_2_32182ca3_for_identities *)(ch->ech).payload.base;
          memset((void *)(((long)local_b40 - (long)ppVar54) + (long)local_b60),0,sVar28);
          ppVar65 = local_b78;
          local_b78 = (ptls_t *)local_bb8;
          sVar27 = (*psVar7->do_decrypt)
                             (psVar7,local_bb8,local_b40,sVar28,CONCAT44(uStack_b44,local_b48),
                              pvVar18,(size_t)ppVar65);
          if (sVar27 != 0xffffffffffffffff) {
            *(byte *)&tls->ech = *(byte *)&tls->ech | 4;
            pbVar61 = (byte *)((ch->ech).payload.len - ((tls->ech).aead)->algo->tag_size);
            puVar44 = (ushort *)((long)&local_b80->id + ch->first_extension_at);
            ticket_ctx.base._0_1_ = 1;
            iVar21 = ptls_buffer__do_pushv(&local_ba8,&ticket_ctx,1);
            if (((iVar21 == 0) &&
                (iVar21 = ptls_buffer__do_pushv(&local_ba8,"",3), sVar27 = local_ba8.off,
                iVar21 == 0)) && (iVar23 = 0x32, iVar21 = iVar23, 1 < (long)pbVar61)) {
              group = *(uint16_t *)local_b78;
              iVar21 = ptls_buffer__do_pushv(&local_ba8,&group,2);
              if (((iVar21 == 0) && (iVar21 = iVar23, (byte *)0x21 < pbVar61)) &&
                 ((iVar21 = ptls_buffer__do_pushv(&local_ba8,(ushort *)((long)local_b78 + 2),0x20),
                  iVar21 == 0 && (iVar21 = iVar23, pbVar61 != (byte *)0x22)))) {
                if ((byte *)(ulong)(byte)*(ushort *)((long)local_b78 + 0x22) <= pbVar61 + -0x23) {
                  if ((byte)*(ushort *)((long)local_b78 + 0x22) == 0) {
                    iVar21 = ptls_buffer__do_pushv(&local_ba8,"",1);
                    sVar59 = local_ba8.off;
                    if ((iVar21 == 0) &&
                       (iVar21 = ptls_buffer__do_pushv
                                           (&local_ba8,(ch->legacy_session_id).base,
                                            (ch->legacy_session_id).len), iVar21 == 0)) {
                      uVar31 = local_ba8.off - sVar59;
                      if (uVar31 < 0x100) {
                        ((undefined1 *)
                        ((long)&(((st_ptls_ech_t *)((long)local_ba8.base + -0x70))->client).
                                first_ech.len + 7))[sVar59] = (char)uVar31;
                        iVar21 = iVar23;
                        if (pbVar61 + -0x23 < (byte *)0x2) goto LAB_00119ada;
                        local_b80 = (ptls_key_exchange_algorithm_t *)
                                    ((ulong)*(byte *)((long)local_b78 + 0x23) * 0x100);
                        local_b48 = (uint)(byte)*(ushort *)((long)local_b78 + 0x24);
                        uStack_b44 = 0;
                        pbVar33 = (byte *)((long)&local_b80->id +
                                          (ulong)(byte)*(ushort *)((long)local_b78 + 0x24));
                        if ((pbVar61 + -0x25 < pbVar33) ||
                           (iVar21 = ptls_buffer__do_pushv(&local_ba8,"",2), sVar59 = local_ba8.off,
                           iVar21 != 0)) goto LAB_00119ada;
                        local_b88 = (st_ptls_ech_t *)((long)local_b78 + 0x25);
                        iVar21 = ptls_buffer__do_pushv(&local_ba8,local_b88,(size_t)pbVar33);
                        if (iVar21 != 0) goto LAB_00119ada;
                        uVar31 = local_ba8.off - sVar59;
                        if (uVar31 < 0x10000) {
                          pbVar52 = (byte *)((long)local_b78 + (long)pbVar61);
                          puVar41 = local_b88->inner_client_random + (long)(pbVar33 + -0x20);
                          uVar38 = (ushort)uVar31;
                          *(ushort *)
                           ((undefined1 *)
                            ((long)&(((st_ptls_ech_t *)((long)local_ba8.base + -0x70))->client).
                                    first_ech.len + 6) + sVar59) = uVar38 << 8 | uVar38 >> 8;
                          iVar21 = iVar23;
                          if (puVar41 != pbVar52) {
                            local_b40 = (anon_struct_168_2_32182ca3_for_identities *)(ulong)*puVar41
                            ;
                            local_b88 = (st_ptls_ech_t *)(puVar41 + 1);
                            if (((local_b40 <= pbVar52 + -(long)local_b88) &&
                                (iVar21 = ptls_buffer__do_pushv(&local_ba8,"",1),
                                sVar59 = local_ba8.off, iVar21 == 0)) &&
                               (iVar21 = ptls_buffer__do_pushv
                                                   (&local_ba8,local_b88,(size_t)local_b40),
                               iVar21 == 0)) {
                              uVar31 = local_ba8.off - sVar59;
                              iVar21 = 0x20c;
                              if (uVar31 < 0x100) {
                                ((undefined1 *)
                                ((long)&(((st_ptls_ech_t *)((long)local_ba8.base + -0x70))->client).
                                        first_ech.len + 7))[sVar59] = (char)uVar31;
                                iVar21 = ptls_buffer__do_pushv(&local_ba8,"",2);
                                sVar59 = local_ba8.off;
                                local_b60 = (void *)CONCAT44(local_b60._4_4_,iVar21);
                                if (iVar21 == 0) {
                                  puVar41 = local_b88->inner_client_random +
                                            (long)((long)(local_b40 + -1) + 0x88);
                                  local_b60 = (void *)CONCAT44(local_b60._4_4_,0x32);
                                  if (1 < (ulong)((long)pbVar52 - (long)puVar41)) {
                                    bVar35 = *puVar41;
                                    bVar19 = puVar41[1];
                                    psVar40 = (st_ptls_ech_t *)(puVar41 + 2);
                                    local_b20 = (st_ptls_ech_t *)
                                                ((ulong)bVar19 + (ulong)bVar35 * 0x100);
                                    if (local_b20 <= (st_ptls_ech_t *)(pbVar52 + -(long)psVar40)) {
                                      local_af0 = 0x10;
                                      local_b20 = (st_ptls_ech_t *)
                                                  (local_b20->inner_client_random +
                                                  (long)&psVar40[-1].client.max_name_length);
                                      local_b58 = (uint8_t *)local_ba8.off;
                                      do {
                                        local_ba8.off = (size_t)local_b58;
                                        if (psVar40 == local_b20) {
                                          uVar31 = (long)local_b58 - sVar59;
                                          local_b60 = (void *)CONCAT44(local_b60._4_4_,0x20c);
                                          if (uVar31 < 0x10000) {
                                            uVar38 = (ushort)uVar31;
                                            local_b88 = (st_ptls_ech_t *)local_ba8.base;
                                            *(ushort *)
                                             ((undefined1 *)
                                              ((long)&(((st_ptls_ech_t *)
                                                       ((long)local_ba8.base + -0x70))->client).
                                                      first_ech.len + 6) + sVar59) =
                                                 uVar38 << 8 | uVar38 >> 8;
                                            uVar31 = (long)local_b58 - sVar27;
                                            iVar21 = 0x20c;
                                            if (uVar31 < 0x1000000) {
                                              puVar41 = (uint8_t *)(sVar27 + (long)local_ba8.base) +
                                                        -3;
                                              for (; local_af0 != -8; local_af0 = local_af0 + -8) {
                                                *puVar41 = (uint8_t)(uVar31 >>
                                                                    ((byte)local_af0 & 0x3f));
                                                puVar41 = puVar41 + 1;
                                              }
                                              pbVar33 = (byte *)((long)local_b80 +
                                                                (long)((long)local_b40 +
                                                                      (ulong)bVar19 +
                                                                      (ulong)bVar35 * 0x100 +
                                                                      CONCAT44(uStack_b44,local_b48)
                                                                      + 0x28));
                                              iVar21 = 0x2f;
                                              while (pbVar61 != pbVar33) {
                                                pbVar52 = (byte *)((long)local_b78 + (long)pbVar33);
                                                pbVar33 = pbVar33 + 1;
                                                if (*pbVar52 != 0) goto LAB_00119ada;
                                              }
                                              memset(local_990,0,0x4b0);
                                              memcpy(local_680,&DAT_00121258,0x198);
                                              memcpy(ch,local_990,0x4b0);
                                              iVar21 = decode_client_hello(tls->ctx,ch,
                                                                           &local_b88->field_0x4,
                                                                           local_b88->
                                                                           inner_client_random +
                                                                           (long)(local_b58 + -0x20)
                                                                           ,local_b68,tls);
                                              if (iVar21 != 0) goto LAB_00119ada;
                                              puVar41 = (tls->ech).inner_client_random;
                                              psVar53 = (st_ptls_client_hello_t *)0x0;
                                              if ((int)local_b70 == 9) {
                                                psVar53 = (st_ptls_client_hello_t *)puVar41;
                                              }
                                              raw_message_00.len = (size_t)tls;
                                              raw_message_00.base = local_b58;
                                              iVar21 = check_client_hello_constraints
                                                                 ((ptls_context_t *)ch,psVar53,
                                                                  (void *)0x1,(int)local_b88,
                                                                  raw_message_00,ppVar65);
                                              if (iVar21 != 0) goto LAB_00119ada;
                                              iVar23 = (int)local_b70;
                                              if ((int)local_b70 != 9) {
                                                puVar57 = ch->random_bytes;
                                                uVar62 = *(undefined8 *)puVar57;
                                                uVar63 = *(undefined8 *)(puVar57 + 8);
                                                uVar14 = *(undefined8 *)(puVar57 + 0x18);
                                                *(undefined8 *)
                                                 ((tls->ech).inner_client_random + 0x10) =
                                                     *(undefined8 *)(puVar57 + 0x10);
                                                *(undefined8 *)
                                                 ((tls->ech).inner_client_random + 0x18) = uVar14;
                                                *(undefined8 *)puVar41 = uVar62;
                                                *(undefined8 *)((tls->ech).inner_client_random + 8)
                                                     = uVar63;
                                              }
                                              goto LAB_00119f16;
                                            }
                                            goto LAB_00119ada;
                                          }
                                          break;
                                        }
                                        if (((long)local_b20 - (long)psVar40 < 2) ||
                                           (((long)local_b20 - (long)psVar40) - 2U < 2)) break;
                                        puVar41 = &psVar40->field_0x4;
                                        uVar31 = (ulong)(ushort)(*(ushort *)&psVar40->field_0x2 << 8
                                                                | *(ushort *)&psVar40->field_0x2 >>
                                                                  8);
                                        if ((ulong)((long)local_b20 - (long)puVar41) < uVar31)
                                        break;
                                        local_ae8 = (st_ptls_ech_t *)(puVar41 + uVar31);
                                        if (CONCAT11(*(byte *)psVar40,psVar40->config_id) == -0x300)
                                        {
                                          if (uVar31 == 0) break;
                                          local_b28 = (st_ptls_ech_t *)
                                                      (ulong)(byte)psVar40->field_0x4;
                                          local_b88 = (st_ptls_ech_t *)&psVar40->field_0x5;
                                          if ((st_ptls_ech_t *)((long)local_ae8 - (long)local_b88) <
                                              local_b28) break;
                                          local_b28 = (st_ptls_ech_t *)
                                                      (local_b28->inner_client_random +
                                                      (long)((long)local_b88 + -0x20));
                                          do {
                                            local_ba8.off = (size_t)local_b58;
                                            if ((long)local_b28 - (long)local_b88 < 2)
                                            goto LAB_0011c354;
                                            puVar17 = &local_b88->field_0x0;
                                            puVar41 = &local_b88->config_id;
                                            uVar38 = CONCAT11(*(byte *)local_b88,
                                                              local_b88->config_id);
                                            if (uVar38 == 0xfe0d) {
LAB_0011c34a:
                                              local_b60 = (void *)CONCAT44(local_b60._4_4_,0x2f);
                                              goto LAB_0011c354;
                                            }
                                            local_b88 = (st_ptls_ech_t *)&local_b88->field_0x2;
                                            while( true ) {
                                              if (((long)local_b50 - (long)puVar44 < 2) ||
                                                 (((long)local_b50 - (long)puVar44) + -2 < 2))
                                              goto LAB_0011c34a;
                                              uVar31 = (ulong)(ushort)(puVar44[1] << 8 |
                                                                      puVar44[1] >> 8);
                                              puVar49 = puVar44 + 2;
                                              if ((long)local_b50 - (long)puVar49 < (long)uVar31) {
                                                __assert_fail(
                                                  "outer_ext_end - outer_ext >= outersize",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                                                  ,0xf63,
                                                  "int rebuild_ch_inner_extensions(ptls_buffer_t *, const uint8_t **, const uint8_t *const, const uint8_t *, const uint8_t *)"
                                                  );
                                              }
                                              if ((ushort)(*puVar44 << 8 | *puVar44 >> 8) == uVar38)
                                              break;
                                              puVar44 = (ushort *)((long)puVar49 + uVar31);
                                            }
                                            sig[0] = *puVar17;
                                            sig[1] = *puVar41;
                                            iVar21 = ptls_buffer__do_pushv(&local_ba8,sig,2);
                                            if (((iVar21 != 0) ||
                                                (iVar21 = ptls_buffer__do_pushv(&local_ba8,"",2),
                                                sVar48 = local_ba8.off, iVar21 != 0)) ||
                                               (iVar21 = ptls_buffer__do_pushv
                                                                   (&local_ba8,puVar49,uVar31),
                                               iVar21 != 0)) goto LAB_0011c4f7;
                                            local_b58 = (uint8_t *)local_ba8.off;
                                            uVar32 = local_ba8.off - sVar48;
                                            if (0xffff < uVar32) goto LAB_0011c799;
                                            puVar44 = (ushort *)((long)puVar49 + uVar31);
                                            uVar38 = (ushort)uVar32;
                                            *(ushort *)
                                             ((undefined1 *)
                                              ((long)&(((st_ptls_ech_t *)
                                                       ((long)local_ba8.base + -0x70))->client).
                                                      first_ech.len + 6) + sVar48) =
                                                 uVar38 << 8 | uVar38 >> 8;
                                          } while (local_b88 != local_b28);
                                        }
                                        else {
                                          local_a80.base =
                                               (uint8_t *)
                                               CONCAT62(local_a80.base._2_6_,*(undefined2 *)psVar40)
                                          ;
                                          iVar21 = ptls_buffer__do_pushv(&local_ba8,&local_a80,2);
                                          if (((iVar21 != 0) ||
                                              (iVar21 = ptls_buffer__do_pushv(&local_ba8,"",2),
                                              sVar48 = local_ba8.off, iVar21 != 0)) ||
                                             (iVar21 = ptls_buffer__do_pushv
                                                                 (&local_ba8,puVar41,uVar31),
                                             iVar21 != 0)) {
LAB_0011c4f7:
                                            local_b60 = (void *)CONCAT44(local_b60._4_4_,iVar21);
                                            break;
                                          }
                                          uVar31 = local_ba8.off - sVar48;
                                          if (0xffff < uVar31) {
LAB_0011c799:
                                            local_b60 = (void *)CONCAT44(local_b60._4_4_,0x20c);
                                            local_b58 = (uint8_t *)local_ba8.off;
                                            break;
                                          }
                                          uVar38 = (ushort)uVar31;
                                          *(ushort *)
                                           ((undefined1 *)
                                            ((long)&(((st_ptls_ech_t *)
                                                     ((long)local_ba8.base + -0x70))->client).
                                                    first_ech.len + 6) + sVar48) =
                                               uVar38 << 8 | uVar38 >> 8;
                                          local_b28 = local_ae8;
                                        }
                                        psVar40 = local_ae8;
                                        local_b58 = (uint8_t *)local_ba8.off;
                                      } while (local_b28 == local_ae8);
                                    }
                                  }
                                }
LAB_0011c354:
                                iVar21 = (int)local_b60;
                              }
                            }
                          }
                          goto LAB_00119ada;
                        }
                      }
                      iVar21 = 0x20c;
                    }
                  }
                  else {
                    iVar21 = 0x2f;
                  }
                }
              }
            }
            goto LAB_00119ada;
          }
          if (iVar23 == 9) {
            iVar21 = 0x33;
            goto LAB_00119ada;
          }
          ptls_aead_free((tls->ech).aead);
          (tls->ech).aead = (ptls_aead_context_t *)0x0;
          goto LAB_00119f16;
        }
      }
LAB_0011a2d1:
      iVar21 = 0x201;
      goto LAB_00119ada;
    }
  }
LAB_00119f16:
  ppVar47 = tls->ctx;
  if ((ppVar47->field_0xb8 & 1) != 0) {
    puVar2 = &(ch->psk).ke_modes;
    *(byte *)puVar2 = (byte)*puVar2 & 0xfe;
  }
  if (iVar23 != 9) {
    if ((ch->legacy_session_id).len != 0) {
      tls->field_0x1e8 = tls->field_0x1e8 | 4;
    }
    puVar41 = (ch->server_name).base;
    if (puVar41 == (uint8_t *)0x0) {
      sVar27 = 0;
    }
    else {
      sVar27 = (ch->server_name).len;
    }
    end = &ch->server_certificate_types;
    sVar59 = (ch->server_certificate_types).count;
    psVar8 = ppVar47->on_client_hello;
    if (psVar8 != (st_ptls_on_client_hello_t *)0x0) {
      sig._48_8_ = &ch->alpn;
      sig._16_8_ = local_b88;
      sig._24_8_ = local_b58;
      sig._32_8_ = (ch->cipher_suites).base;
      sig._40_8_ = (ch->cipher_suites).len;
      sig._56_8_ = (ch->alpn).count;
      sig._0_8_ = puVar41;
      sig._8_8_ = sVar27;
      iVar21 = (*psVar8->cb)(psVar8,tls,(ptls_on_client_hello_parameters_t *)sig);
      if (iVar21 != 0) goto LAB_00119ada;
      sVar59 = (ch->server_certificate_types).count;
      ppVar47 = tls->ctx;
    }
    bVar35 = (byte)ppVar47->field_0xb8 >> 4 & 2;
    if ((sVar59 != 0) || (bVar35 != 0)) {
      uVar31 = 0xffffffffffffffff;
      do {
        iVar21 = 0x2b;
        if (uVar31 - sVar59 == -1) goto LAB_00119ada;
        uVar32 = uVar31 + 1;
        lVar34 = uVar31 + 1;
        uVar31 = uVar32;
      } while ((ch->server_certificate_types).list[lVar34] != bVar35);
      if (sVar59 <= uVar32) goto LAB_00119ada;
    }
LAB_0011a0ab:
    ppVar9 = (ppVar47->pre_shared_key).hash;
    puVar44 = (ushort *)(ch->cipher_suites).base;
    puVar49 = (ushort *)((ch->cipher_suites).len + (long)puVar44);
    bVar35 = (byte)ppVar47->field_0xb8 >> 7;
    paVar56 = (anon_struct_16_2_f7306ffc_for_server_certificate_types *)0xffffffffffffffff;
LAB_0011a0e6:
    do {
      if (puVar44 == puVar49) {
        if (paVar56 != (anon_struct_16_2_f7306ffc_for_server_certificate_types *)0xffffffffffffffff)
        goto LAB_0011a1ac;
        goto LAB_0011a1bf;
      }
      iVar21 = 0x32;
      if ((long)puVar49 - (long)puVar44 < 2) goto LAB_00119ada;
      uVar38 = *puVar44 << 8 | *puVar44 >> 8;
      puVar44 = puVar44 + 1;
      for (end = (anon_struct_16_2_f7306ffc_for_server_certificate_types *)0x0;
          preferred = ppVar47->cipher_suites[(long)end], preferred != (ptls_cipher_suite_t *)0x0;
          end = (anon_struct_16_2_f7306ffc_for_server_certificate_types *)(end->list + 1)) {
        if ((preferred->id == uVar38) &&
           ((ppVar9 == (ptls_hash_algorithm_t *)0x0 || (preferred->hash == ppVar9)))) {
          if ((bVar35 & uVar38 == 0x1303) != 0 || (ppVar47->field_0xb8 & 0x40) == 0)
          goto LAB_0011a1b0;
          if (end < paVar56) {
            bVar35 = 0;
            paVar56 = end;
            if (end != (anon_struct_16_2_f7306ffc_for_server_certificate_types *)0x0)
            goto LAB_0011a0e6;
            paVar56 = (anon_struct_16_2_f7306ffc_for_server_certificate_types *)0x0;
            goto LAB_0011a1ac;
          }
        }
      }
      bVar35 = 0;
    } while( true );
  }
  if (((ch->psk).field_0xb4 & 1) == 0) {
    end = (anon_struct_16_2_f7306ffc_for_server_certificate_types *)tls->server_name;
    if (end != (anon_struct_16_2_f7306ffc_for_server_certificate_types *)0x0) {
      sVar28 = strlen((char *)end);
      iVar21 = 0x28;
      if (((ch->server_name).len != sVar28) ||
         (iVar23 = bcmp((ch->server_name).base,end,sVar28), iVar23 != 0)) goto LAB_00119ada;
    }
    goto LAB_0011a0ab;
  }
  iVar21 = 0x32;
  goto LAB_00119ada;
LAB_0011a1ac:
  preferred = ppVar47->cipher_suites[(long)paVar56];
LAB_0011a1b0:
  if ((int)local_b70 == 9) {
    if (tls->cipher_suite != preferred) {
LAB_0011a1bf:
      iVar21 = 0x28;
      goto LAB_00119ada;
    }
  }
  else {
    tls->cipher_suite = preferred;
    ppVar29 = key_schedule_new(preferred,(ptls_cipher_suite_t **)0x0,0);
    tls->key_schedule = ppVar29;
    if (ppVar29 == (ptls_key_schedule_t *)0x0) goto LAB_0011a2d1;
  }
  puVar44 = (ushort *)(ch->key_shares).base;
  if ((puVar44 == (ushort *)0x0) ||
     (pppVar30 = tls->ctx->key_exchanges, pppVar30 == (ptls_key_exchange_algorithm_t **)0x0)) {
    local_b80 = (ptls_key_exchange_algorithm_t *)0x0;
    local_b50 = (uint8_t *)0x0;
    local_b48 = 0;
    uStack_b44 = 0;
  }
  else {
    uVar31 = (ch->key_shares).len;
    iVar21 = 0x32;
    if (uVar31 < 2) goto LAB_00119ada;
    uVar32 = (ulong)(ushort)(*puVar44 << 8 | *puVar44 >> 8);
    local_a80.base = (uint8_t *)(puVar44 + 1);
    if (uVar31 - 2 < uVar32) goto LAB_00119ada;
    local_b78 = (ptls_t *)(uVar31 + (long)puVar44);
    end = (anon_struct_16_2_f7306ffc_for_server_certificate_types *)((long)puVar44 + uVar32 + 2);
    ppVar54 = (ptls_key_exchange_algorithm_t *)0x0;
    puVar41 = (uint8_t *)0x0;
    uVar62._0_1_ = '\0';
    uVar62._1_1_ = '\0';
    uVar62._2_1_ = '\0';
    uVar62._3_1_ = '\0';
    uVar62._4_1_ = '\0';
    uVar62._5_1_ = '\0';
    uVar62._6_1_ = '\0';
    uVar62._7_1_ = '\0';
    while ((anon_struct_16_2_f7306ffc_for_server_certificate_types *)local_a80.base != end) {
      iVar21 = decode_key_share_entry(&group,(ptls_iovec_t *)sig,&local_a80.base,(uint8_t *)end);
      pppVar50 = pppVar30;
      if (iVar21 != 0) goto LAB_00119ada;
      for (; ppVar10 = *pppVar50, ppVar10 != (ptls_key_exchange_algorithm_t *)0x0;
          pppVar50 = pppVar50 + 1) {
        puVar57 = puVar41;
        uVar63 = uVar62;
        if ((ppVar54 == (ptls_key_exchange_algorithm_t *)0x0) &&
           (ppVar54 = ppVar10, puVar57 = (uint8_t *)sig._0_8_, uVar63 = sig._8_8_,
           ppVar10->id != group)) {
          ppVar54 = (ptls_key_exchange_algorithm_t *)0x0;
          puVar57 = puVar41;
          uVar63 = uVar62;
        }
        puVar41 = puVar57;
        uVar62 = uVar63;
      }
    }
    local_b48 = (uint)uVar62;
    uStack_b44 = SUB84(uVar62,4);
    iVar21 = 0x32;
    local_b80 = ppVar54;
    local_b50 = puVar41;
    if ((ptls_t *)end != local_b78) goto LAB_00119ada;
  }
  iVar23 = 0x28;
  if ((int)local_b70 != 9) {
    if (((ch->cookie).all.len == 0) || (local_b80 == (ptls_key_exchange_algorithm_t *)0x0)) {
      uVar42 = (undefined4)CONCAT71((int7)((ulong)end >> 8),1);
      if ((((ch->key_shares).base != (uint8_t *)0x0) &&
          (pppVar30 = tls->ctx->key_exchanges, pppVar30 != (ptls_key_exchange_algorithm_t **)0x0))
         && ((local_b80 == (ptls_key_exchange_algorithm_t *)0x0 ||
             ((local_b68 != (ptls_handshake_properties_t *)0x0 &&
              ((*(byte *)((long)&local_b68->field_0 + 0x60) & 1) != 0)))))) {
        puVar44 = (ushort *)(ch->negotiated_groups).base;
        iVar21 = 0x6d;
        if (puVar44 != (ushort *)0x0) {
          uVar31 = (ch->negotiated_groups).len;
          if ((uVar31 < 2) ||
             (uVar32 = (ulong)(ushort)(*puVar44 << 8 | *puVar44 >> 8), uVar31 - 2 < uVar32)) {
LAB_0011aad5:
            iVar21 = 0x32;
          }
          else {
            lVar34 = 8;
            puVar49 = (ushort *)(uVar31 + (long)puVar44);
            puVar51 = (ushort *)((long)puVar44 + uVar32 + 2);
            while (puVar44 = puVar44 + 1, puVar44 != puVar51) {
              if ((long)puVar51 - (long)puVar44 < 2) goto LAB_0011aad5;
              pppVar50 = pppVar30;
              while (ppVar54 = *pppVar50, ppVar54 != (ptls_key_exchange_algorithm_t *)0x0) {
                pppVar50 = pppVar50 + 1;
                if (ppVar54->id == (uint16_t)(*puVar44 << 8 | *puVar44 >> 8)) {
                  ptls__key_schedule_update_hash
                            (tls->key_schedule,(uint8_t *)local_b88,(size_t)local_b58,0);
                  if (tls->key_schedule->generation != 0) {
                    __assert_fail("tls->key_schedule->generation == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                                  ,0x11d5,
                                  "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                                 );
                  }
                  if (((local_b68 == (ptls_handshake_properties_t *)0x0) ||
                      ((*(byte *)((long)&local_b68->field_0 + 0x60) & 2) == 0)) ||
                     (bVar20 = true,
                     (undefined1  [112])((undefined1  [112])tls->ech & (undefined1  [112])0x4) !=
                     (undefined1  [112])0x0)) {
                    key_schedule_transform_post_ch1hash(tls->key_schedule);
                    key_schedule_extract(tls->key_schedule,(tls->ctx->pre_shared_key).secret);
                    bVar20 = false;
                  }
                  iVar21 = (*emitter->begin_message)(emitter);
                  if (iVar21 != 0) goto LAB_00119ada;
                  local_b70 = (ptls_key_schedule_t *)emitter->buf;
                  local_b2b = 2;
                  iVar21 = ptls_buffer__do_pushv((ptls_buffer_t *)local_b70,&local_b2b,1);
                  if ((iVar21 != 0) ||
                     (iVar21 = ptls_buffer__do_pushv((ptls_buffer_t *)local_b70,"",3), iVar21 != 0))
                  goto LAB_00119ada;
                  local_b88 = *(st_ptls_ech_t **)(local_b70->secret + 0xc);
                  local_b50 = (uint8_t *)emitter->buf->off;
                  local_aa8[0] = 0x303;
                  iVar21 = ptls_buffer__do_pushv(emitter->buf,local_aa8,2);
                  if ((iVar21 != 0) ||
                     (iVar21 = ptls_buffer_reserve(emitter->buf,0x20), iVar21 != 0))
                  goto LAB_00119ada;
                  puVar41 = emitter->buf->base;
                  sVar27 = emitter->buf->off;
                  puVar57 = puVar41 + sVar27 + 0x10;
                  puVar57[0] = 0xc2;
                  puVar57[1] = 0xa2;
                  puVar57[2] = '\x11';
                  puVar57[3] = '\x16';
                  puVar57[4] = 'z';
                  puVar57[5] = 0xbb;
                  puVar57[6] = 0x8c;
                  puVar57[7] = '^';
                  puVar57[8] = '\a';
                  puVar57[9] = 0x9e;
                  puVar57[10] = '\t';
                  puVar57[0xb] = 0xe2;
                  puVar57[0xc] = 200;
                  puVar57[0xd] = 0xa8;
                  puVar57[0xe] = '3';
                  puVar57[0xf] = 0x9c;
                  puVar41 = puVar41 + sVar27;
                  puVar41[0] = 0xcf;
                  puVar41[1] = '!';
                  puVar41[2] = 0xad;
                  puVar41[3] = 't';
                  puVar41[4] = 0xe5;
                  puVar41[5] = 0x9a;
                  puVar41[6] = 'a';
                  puVar41[7] = '\x11';
                  puVar41[8] = 0xbe;
                  puVar41[9] = '\x1d';
                  puVar41[10] = 0x8c;
                  puVar41[0xb] = '\x02';
                  puVar41[0xc] = '\x1e';
                  puVar41[0xd] = 'e';
                  puVar41[0xe] = 0xb8;
                  puVar41[0xf] = 0x91;
                  ppVar45 = emitter->buf;
                  psVar1 = &ppVar45->off;
                  *psVar1 = *psVar1 + 0x20;
                  iVar21 = ptls_buffer__do_pushv(ppVar45,"",1);
                  if (iVar21 != 0) goto LAB_00119ada;
                  sVar27 = emitter->buf->off;
                  iVar21 = ptls_buffer__do_pushv
                                     (emitter->buf,(ch->legacy_session_id).base,
                                      (ch->legacy_session_id).len);
                  if (iVar21 != 0) goto LAB_00119ada;
                  uVar31 = emitter->buf->off - sVar27;
                  if (0xff < uVar31) goto LAB_0011b4c3;
                  emitter->buf->base[sVar27 - 1] = (uint8_t)uVar31;
                  uVar38 = tls->cipher_suite->id;
                  local_aae[2] = uVar38 << 8 | uVar38 >> 8;
                  iVar21 = ptls_buffer__do_pushv(emitter->buf,local_aae + 2,2);
                  if (iVar21 == 0) {
                    local_b2c = 0;
                    iVar21 = ptls_buffer__do_pushv(emitter->buf,&local_b2c,1);
                    if ((iVar21 == 0) &&
                       (iVar21 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar21 == 0)) {
                      sVar27 = emitter->buf->off;
                      local_aae[1] = 0x2b00;
                      iVar21 = ptls_buffer__do_pushv(emitter->buf,local_aae + 1,2);
                      if ((iVar21 == 0) &&
                         (iVar21 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar21 == 0)) {
                        sVar59 = emitter->buf->off;
                        local_aae[0] = ch->selected_version << 8 | ch->selected_version >> 8;
                        iVar21 = ptls_buffer__do_pushv(emitter->buf,local_aae,2);
                        if (iVar21 == 0) {
                          uVar31 = emitter->buf->off - sVar59;
                          if (uVar31 < 0x10000) {
                            local_b50 = local_b50 + -4;
                            for (; lVar34 != -8; lVar34 = lVar34 + -8) {
                              emitter->buf->base[sVar59 - 2] =
                                   (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                              sVar59 = sVar59 + 1;
                            }
                            ppVar45 = emitter->buf;
                            if (local_b80 == (ptls_key_exchange_algorithm_t *)0x0) {
                              local_ab0 = 0x3300;
                              iVar21 = ptls_buffer__do_pushv(ppVar45,&local_ab0,2);
                              if ((iVar21 != 0) ||
                                 (iVar21 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar21 != 0))
                              goto LAB_00119ada;
                              sVar59 = emitter->buf->off;
                              local_ab8[3] = ppVar54->id << 8 | ppVar54->id >> 8;
                              iVar21 = ptls_buffer__do_pushv(emitter->buf,local_ab8 + 3,2);
                              if (iVar21 != 0) goto LAB_00119ada;
                              uVar31 = emitter->buf->off - sVar59;
                              if (uVar31 < 0x10000) {
                                for (lVar34 = 8; lVar34 != -8; lVar34 = lVar34 + -8) {
                                  emitter->buf->base[sVar59 - 2] =
                                       (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                                  sVar59 = sVar59 + 1;
                                }
                                ppVar45 = emitter->buf;
                                goto LAB_0011bf02;
                              }
                            }
                            else {
LAB_0011bf02:
                              if ((undefined1  [112])
                                  ((undefined1  [112])tls->ech & (undefined1  [112])0x4) ==
                                  (undefined1  [112])0x0) {
                                sVar48 = 0;
                              }
                              else {
                                local_ab8[2] = 0xdfe;
                                iVar21 = ptls_buffer__do_pushv(ppVar45,local_ab8 + 2,2);
                                if ((iVar21 != 0) ||
                                   (iVar21 = ptls_buffer__do_pushv(ppVar45,"",2), iVar21 != 0))
                                goto LAB_00119ada;
                                sVar59 = ppVar45->off;
                                iVar21 = ptls_buffer_reserve(ppVar45,8);
                                if (iVar21 != 0) goto LAB_00119ada;
                                puVar41 = ppVar45->base + ppVar45->off;
                                puVar41[0] = '\0';
                                puVar41[1] = '\0';
                                puVar41[2] = '\0';
                                puVar41[3] = '\0';
                                puVar41[4] = '\0';
                                puVar41[5] = '\0';
                                puVar41[6] = '\0';
                                puVar41[7] = '\0';
                                sVar48 = ppVar45->off;
                                ppVar45->off = sVar48 + 8;
                                uVar31 = (sVar48 + 8) - sVar59;
                                if (0xffff < uVar31) goto LAB_0011b4c3;
                                ppVar45->base[sVar59 - 2] = (uint8_t)(uVar31 >> 8);
                                ppVar45->base[sVar59 - 1] = (uint8_t)uVar31;
                              }
                              if (bVar20) {
                                local_ab8[1] = 0x2c00;
                                iVar21 = ptls_buffer__do_pushv(ppVar45,local_ab8 + 1,2);
                                if ((iVar21 != 0) ||
                                   (iVar21 = ptls_buffer__do_pushv(ppVar45,"",2), iVar21 != 0))
                                goto LAB_00119ada;
                                sVar59 = ppVar45->off;
                                iVar21 = ptls_buffer__do_pushv(ppVar45,"",2);
                                if (iVar21 != 0) goto LAB_00119ada;
                                local_b58 = (uint8_t *)ppVar45->off;
                                iVar21 = ptls_buffer__do_pushv(ppVar45,"",2);
                                if (iVar21 != 0) goto LAB_00119ada;
                                local_b48 = (uint)ppVar45->off;
                                uStack_b44 = (undefined4)(ppVar45->off >> 0x20);
                                iVar21 = ptls_buffer__do_pushv(ppVar45,"",1);
                                if (iVar21 != 0) goto LAB_00119ada;
                                local_b78 = (ptls_t *)ppVar45->off;
                                local_b40 = (anon_struct_168_2_32182ca3_for_identities *)
                                            tls->cipher_suite->hash->digest_size;
                                iVar21 = ptls_buffer_reserve(ppVar45,(size_t)local_b40);
                                if (iVar21 != 0) goto LAB_00119ada;
                                if (tls->key_schedule->hashes[0].ctx_outer !=
                                    (ptls_hash_context_t *)0x0) {
                                  __assert_fail("sched->hashes[0].ctx_outer == NULL",
                                                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                                                ,0x587,
                                                "void key_schedule_extract_ch1hash(ptls_key_schedule_t *, uint8_t *)"
                                               );
                                }
                                psVar12 = tls->key_schedule->hashes[0].ctx;
                                (*psVar12->final)(psVar12,ppVar45->base + ppVar45->off,
                                                  PTLS_HASH_FINAL_MODE_RESET);
                                pbVar61 = (byte *)((long)&local_b40->list[0].identity.base +
                                                  ppVar45->off);
                                ppVar45->off = (size_t)pbVar61;
                                uVar31 = (long)pbVar61 - (long)local_b78;
                                if (uVar31 < 0x100) {
                                  local_b32[5] = local_b80 == (ptls_key_exchange_algorithm_t *)0x0;
                                  (ppVar45->base + -1)[(long)local_b78] = (uint8_t)uVar31;
                                  iVar21 = ptls_buffer__do_pushv(ppVar45,local_b32 + 5,1);
                                  if (iVar21 != 0) goto LAB_00119ada;
                                  uVar31 = ppVar45->off - CONCAT44(uStack_b44,local_b48);
                                  if (uVar31 < 0x10000) {
                                    ppVar45->base[CONCAT44(uStack_b44,local_b48) + -2] =
                                         (uint8_t)(uVar31 >> 8);
                                    ppVar45->base[CONCAT44(uStack_b44,local_b48) + -1] =
                                         (uint8_t)uVar31;
                                    local_b80 = (ptls_key_exchange_algorithm_t *)ppVar45->off;
                                    iVar21 = ptls_buffer__do_pushv(ppVar45,"",1);
                                    if (iVar21 != 0) goto LAB_00119ada;
                                    local_b48 = (uint)ppVar45->off;
                                    uStack_b44 = (undefined4)(ppVar45->off >> 0x20);
                                    local_b78 = (ptls_t *)
                                                (*tls->ctx->cipher_suites)->hash->digest_size;
                                    iVar21 = ptls_buffer_reserve(ppVar45,(size_t)local_b78);
                                    if ((iVar21 != 0) ||
                                       (tbs.len = (long)local_b80 - (long)local_b58,
                                       tbs.base = local_b58 + (long)ppVar45->base,
                                       iVar21 = calc_cookie_signature
                                                          (tls,local_b68,ppVar54,tbs,
                                                           ppVar45->base + ppVar45->off),
                                       iVar21 != 0)) goto LAB_00119ada;
                                    sVar60 = (long)local_b78 + ppVar45->off;
                                    ppVar45->off = sVar60;
                                    uVar31 = sVar60 - CONCAT44(uStack_b44,local_b48);
                                    if (uVar31 < 0x100) {
                                      ppVar45->base[CONCAT44(uStack_b44,local_b48) + -1] =
                                           (uint8_t)uVar31;
                                      uVar31 = ppVar45->off - (long)local_b58;
                                      if (uVar31 < 0x10000) {
                                        local_b58[(long)(ppVar45->base + -2)] =
                                             (uint8_t)(uVar31 >> 8);
                                        local_b58[(long)(ppVar45->base + -1)] = (uint8_t)uVar31;
                                        uVar31 = ppVar45->off - sVar59;
                                        if (uVar31 < 0x10000) {
                                          ppVar45->base[sVar59 - 2] = (uint8_t)(uVar31 >> 8);
                                          ppVar45->base[sVar59 - 1] = (uint8_t)uVar31;
                                          goto LAB_0011c1c4;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                              else {
LAB_0011c1c4:
                                uVar31 = emitter->buf->off - sVar27;
                                if (uVar31 < 0x10000) {
                                  for (lVar34 = 8; lVar34 != -8; lVar34 = lVar34 + -8) {
                                    emitter->buf->base[sVar27 - 2] =
                                         (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                                    sVar27 = sVar27 + 1;
                                  }
                                  uVar31 = *(long *)(local_b70->secret + 0xc) - (long)local_b88;
                                  iVar21 = 0x20c;
                                  if (uVar31 < 0x1000000) {
                                    for (lVar34 = 0x10; lVar34 != -8; lVar34 = lVar34 + -8) {
                                      local_b88->inner_client_random[*(long *)local_b70 + -0x23] =
                                           (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                                      local_b88 = (st_ptls_ech_t *)&local_b88->config_id;
                                    }
                                    iVar21 = (*emitter->commit_message)(emitter);
                                    if ((iVar21 == 0) &&
                                       ((sVar48 == 0 ||
                                        (puVar41 = emitter->buf->base,
                                        message_00.base = local_b50 + (long)puVar41,
                                        message_00.len = emitter->buf->off - (long)local_b50,
                                        iVar21 = ech_calc_confirmation
                                                           (tls->key_schedule,puVar41 + sVar48,
                                                            (tls->ech).inner_client_random,
                                                            "hrr ech accept confirmation",message_00
                                                           ), iVar21 == 0)))) {
                                      ptls__key_schedule_update_hash
                                                (tls->key_schedule,
                                                 local_b50 + (long)emitter->buf->base,
                                                 emitter->buf->off - (long)local_b50,0);
                                      if (bVar20) {
                                        iVar23 = push_change_cipher_spec(tls,emitter);
                                        iVar21 = 0x206;
                                        if (iVar23 != 0) {
                                          iVar21 = iVar23;
                                        }
                                      }
                                      else {
                                        tls->state = PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO;
                                        if (((ch->psk).field_0xb4 & 1) != 0) {
                                          (tls->field_19).server.early_data_skipped_bytes = 0;
                                        }
                                        iVar21 = 0x202;
                                      }
                                    }
                                  }
                                  goto LAB_00119ada;
                                }
                              }
                            }
                          }
                          goto LAB_0011b4c3;
                        }
                      }
                    }
                  }
                  goto LAB_00119ada;
                }
              }
            }
            iVar21 = 0x32;
            if (puVar51 == puVar49) {
              iVar21 = iVar23;
            }
          }
        }
        goto LAB_00119ada;
      }
      goto LAB_0011a31a;
    }
    sVar27 = (*tls->ctx->cipher_suites)->hash->digest_size;
    iVar21 = calc_cookie_signature(tls,local_b68,local_b80,(ch->cookie).tbs,sig);
    if (((iVar21 != 0) || (iVar21 = iVar23, (ch->cookie).signature.len != sVar27)) ||
       (iVar24 = (*ptls_mem_equal)((ch->cookie).signature.base,sig,sVar27), iVar24 == 0))
    goto LAB_00119ada;
    sig[3] = (uint8_t)(tls->key_schedule->hashes[0].algo)->digest_size;
    sig[0] = 0xfe;
    sig[1] = '\0';
    sig[2] = '\0';
    ptls__key_schedule_update_hash(tls->key_schedule,sig,4,0);
    ptls__key_schedule_update_hash
              (tls->key_schedule,(ch->cookie).ch1_hash.base,(ch->cookie).ch1_hash.len,0);
    key_schedule_extract(tls->key_schedule,(tls->ctx->pre_shared_key).secret);
    sVar27 = emitter->buf->off;
    iVar21 = (*emitter->begin_message)(emitter);
    if (iVar21 != 0) goto LAB_00119ada;
    ppVar45 = emitter->buf;
    local_b29 = 2;
    iVar21 = ptls_buffer__do_pushv(ppVar45,&local_b29,1);
    if ((iVar21 != 0) || (iVar21 = ptls_buffer__do_pushv(ppVar45,"",3), iVar21 != 0))
    goto LAB_00119ada;
    sVar59 = ppVar45->off;
    sVar48 = emitter->buf->off;
    local_a9a = 0x303;
    iVar21 = ptls_buffer__do_pushv(emitter->buf,&local_a9a,2);
    if ((iVar21 != 0) || (iVar21 = ptls_buffer_reserve(emitter->buf,0x20), iVar21 != 0))
    goto LAB_00119ada;
    puVar41 = emitter->buf->base;
    sVar60 = emitter->buf->off;
    puVar57 = puVar41 + sVar60 + 0x10;
    puVar57[0] = 0xc2;
    puVar57[1] = 0xa2;
    puVar57[2] = '\x11';
    puVar57[3] = '\x16';
    puVar57[4] = 'z';
    puVar57[5] = 0xbb;
    puVar57[6] = 0x8c;
    puVar57[7] = '^';
    puVar57[8] = '\a';
    puVar57[9] = 0x9e;
    puVar57[10] = '\t';
    puVar57[0xb] = 0xe2;
    puVar57[0xc] = 200;
    puVar57[0xd] = 0xa8;
    puVar57[0xe] = '3';
    puVar57[0xf] = 0x9c;
    puVar41 = puVar41 + sVar60;
    puVar41[0] = 0xcf;
    puVar41[1] = '!';
    puVar41[2] = 0xad;
    puVar41[3] = 't';
    puVar41[4] = 0xe5;
    puVar41[5] = 0x9a;
    puVar41[6] = 'a';
    puVar41[7] = '\x11';
    puVar41[8] = 0xbe;
    puVar41[9] = '\x1d';
    puVar41[10] = 0x8c;
    puVar41[0xb] = '\x02';
    puVar41[0xc] = '\x1e';
    puVar41[0xd] = 'e';
    puVar41[0xe] = 0xb8;
    puVar41[0xf] = 0x91;
    ppVar55 = emitter->buf;
    psVar1 = &ppVar55->off;
    *psVar1 = *psVar1 + 0x20;
    iVar21 = ptls_buffer__do_pushv(ppVar55,"",1);
    if (iVar21 != 0) goto LAB_00119ada;
    sVar60 = emitter->buf->off;
    iVar21 = ptls_buffer__do_pushv
                       (emitter->buf,(ch->legacy_session_id).base,(ch->legacy_session_id).len);
    if (iVar21 != 0) goto LAB_00119ada;
    uVar31 = emitter->buf->off - sVar60;
    if (0xff < uVar31) goto LAB_0011b4c3;
    emitter->buf->base[sVar60 - 1] = (uint8_t)uVar31;
    uVar38 = tls->cipher_suite->id;
    local_aa0[2] = uVar38 << 8 | uVar38 >> 8;
    iVar21 = ptls_buffer__do_pushv(emitter->buf,local_aa0 + 2,2);
    if (iVar21 != 0) goto LAB_00119ada;
    local_b2a = 0;
    iVar21 = ptls_buffer__do_pushv(emitter->buf,&local_b2a,1);
    if ((iVar21 != 0) || (iVar21 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar21 != 0))
    goto LAB_00119ada;
    sVar60 = emitter->buf->off;
    local_aa0[1] = 0x2b00;
    iVar21 = ptls_buffer__do_pushv(emitter->buf,local_aa0 + 1,2);
    if ((iVar21 != 0) || (iVar21 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar21 != 0))
    goto LAB_00119ada;
    sVar46 = emitter->buf->off;
    local_aa0[0] = ch->selected_version << 8 | ch->selected_version >> 8;
    iVar21 = ptls_buffer__do_pushv(emitter->buf,local_aa0,2);
    if (iVar21 != 0) goto LAB_00119ada;
    uVar31 = emitter->buf->off - sVar46;
    if (uVar31 < 0x10000) {
      lVar37 = sVar48 - 4;
      for (lVar34 = 8; ppVar55 = emitter->buf, lVar34 != -8; lVar34 = lVar34 + -8) {
        ppVar55->base[sVar46 - 2] = (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
        sVar46 = sVar46 + 1;
      }
      if (((ch->cookie).field_0x40 & 1) != 0) {
        local_aa2 = 0x3300;
        iVar21 = ptls_buffer__do_pushv(ppVar55,&local_aa2,2);
        if ((iVar21 != 0) || (iVar21 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar21 != 0))
        goto LAB_00119ada;
        sVar48 = emitter->buf->off;
        local_aa8[2] = local_b80->id << 8 | local_b80->id >> 8;
        iVar21 = ptls_buffer__do_pushv(emitter->buf,local_aa8 + 2,2);
        if (iVar21 != 0) goto LAB_00119ada;
        uVar31 = emitter->buf->off - sVar48;
        if (0xffff < uVar31) goto LAB_0011b4c3;
        for (lVar34 = 8; lVar34 != -8; lVar34 = lVar34 + -8) {
          emitter->buf->base[sVar48 - 2] = (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
          sVar48 = sVar48 + 1;
        }
        ppVar55 = emitter->buf;
      }
      local_aa8[1] = 0x2c00;
      iVar21 = ptls_buffer__do_pushv(ppVar55,local_aa8 + 1,2);
      if ((iVar21 != 0) || (iVar21 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar21 != 0))
      goto LAB_00119ada;
      sVar48 = emitter->buf->off;
      iVar21 = ptls_buffer__do_pushv(emitter->buf,(ch->cookie).all.base,(ch->cookie).all.len);
      if (iVar21 != 0) goto LAB_00119ada;
      uVar31 = emitter->buf->off - sVar48;
      if (uVar31 < 0x10000) {
        for (lVar34 = 8; lVar34 != -8; lVar34 = lVar34 + -8) {
          emitter->buf->base[sVar48 - 2] = (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
          sVar48 = sVar48 + 1;
        }
        uVar31 = emitter->buf->off - sVar60;
        if (uVar31 < 0x10000) {
          for (lVar34 = 8; lVar34 != -8; lVar34 = lVar34 + -8) {
            emitter->buf->base[sVar60 - 2] = (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
            sVar60 = sVar60 + 1;
          }
          uVar31 = ppVar45->off - sVar59;
          iVar21 = 0x20c;
          if (0xffffff < uVar31) goto LAB_00119ada;
          for (lVar34 = 0x10; lVar34 != -8; lVar34 = lVar34 + -8) {
            ppVar45->base[sVar59 - 3] = (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
            sVar59 = sVar59 + 1;
          }
          iVar21 = (*emitter->commit_message)(emitter);
          if (iVar21 != 0) goto LAB_00119ada;
          ptls__key_schedule_update_hash
                    (tls->key_schedule,emitter->buf->base + lVar37,emitter->buf->off - lVar37,0);
          uVar42 = 0;
          emitter->buf->off = sVar27;
          goto LAB_0011a31a;
        }
      }
    }
    goto LAB_0011b4c3;
  }
  uVar42 = 0;
LAB_0011a31a:
  iVar21 = report_unknown_extensions(tls,local_b68,ch->unknown_extensions);
  if (iVar21 != 0) goto LAB_00119ada;
  puVar44 = (ushort *)(ch->psk).hash_end;
  uVar31 = 0xffffffffffffffff;
  local_b70 = (ptls_key_schedule_t *)CONCAT44(local_b70._4_4_,uVar42);
  if ((puVar44 == (ushort *)0x0) || (((ch->psk).ke_modes & 3) == 0)) {
    bVar20 = false;
  }
  else {
    bVar20 = false;
    ppVar47 = tls->ctx;
    local_b78 = (ptls_t *)puVar44;
    if (((ppVar47->field_0xb8 & 8) == 0) &&
       ((((char)uVar42 != '\0' && (ppVar47->encrypt_ticket != (ptls_encrypt_ticket_t *)0x0)) ||
        ((ppVar47->pre_shared_key).identity.base != (uint8_t *)0x0)))) {
      local_b78 = (ptls_t *)((long)puVar44 - (long)local_b88);
      local_b60 = (void *)(*ppVar47->get_time->cb)(ppVar47->get_time);
      local_a80.base = "";
      paVar58 = &(ch->psk).identities;
      local_a80.capacity = 0;
      local_a80.off = 0;
      local_a80.is_allocated = '\0';
      local_a80.align_bits = '\0';
      local_b40 = paVar58;
      for (uVar31 = 0; uVar31 < (ch->psk).identities.count; uVar31 = uVar31 + 1) {
        ppVar43 = &paVar58->list[uVar31].identity;
        ppVar47 = tls->ctx;
        puVar41 = (ppVar47->pre_shared_key).identity.base;
        if (puVar41 == (uint8_t *)0x0) {
          psVar11 = ppVar47->encrypt_ticket;
          if ((psVar11 != (st_ptls_encrypt_ticket_t *)0x0) &&
             (ppVar47->key_exchanges != (ptls_key_exchange_algorithm_t **)0x0)) {
            bVar64 = uVar31 == 0;
            local_a80.off = 0;
            iVar21 = (*psVar11->cb)(psVar11,tls,0,&local_a80,*ppVar43);
            if (iVar21 != 0) {
              if (iVar21 != 0x209) goto LAB_0011a524;
              bVar64 = false;
            }
            iVar21 = decode_session_identifier
                               (&issue_at,(ptls_iovec_t *)&group,&age_add,&ticket_ctx,
                                &ticket_key_exchange_id,&ticket_csid,&ticket_negotiated_protocol,
                                local_a80.base,(uint8_t *)(local_a80.off + (long)local_a80.base));
            if (((iVar21 == 0) && (issue_at <= local_b60)) &&
               (ppVar47 = tls->ctx,
               (long)local_b60 - issue_at <= (ulong)ppVar47->ticket_lifetime * 1000)) {
              bVar20 = false;
              if (!(bool)(bVar64 ^ 1) && ((ch->psk).field_0xb4 & 1) != 0) {
                uVar36 = (long)local_b60 - (issue_at + (*(int *)&ppVar43[1].base - age_add));
                uVar32 = -uVar36;
                if (0 < (long)uVar36) {
                  uVar32 = uVar36;
                }
                bVar20 = uVar32 < 0x2711 && ppVar47->max_early_data_size != 0;
              }
              paVar58 = local_b40;
              if (((ppVar47->ticket_context).field_0x20 & 1) == 0) {
                pcVar39 = tls->server_name;
                if (ticket_ctx.len == 0) {
                  if (pcVar39 == (char *)0x0) goto LAB_0011a611;
                }
                else if ((pcVar39 != (char *)0x0) &&
                        (x.base._1_7_ = ticket_ctx.base._1_7_, x.base._0_1_ = ticket_ctx.base._0_1_,
                        x.len = ticket_ctx.len, iVar21 = vec_is_string(x,pcVar39), iVar21 != 0)) {
LAB_0011a611:
                  paVar58 = local_b40;
                  pppVar30 = ppVar47->key_exchanges;
                  do {
                    ppVar54 = *pppVar30;
                    if (ppVar54 == (ptls_key_exchange_algorithm_t *)0x0) goto LAB_0011a524;
                    pppVar30 = pppVar30 + 1;
                  } while (ppVar54->id != ticket_key_exchange_id);
                  tls->key_share = ppVar54;
                  if ((ticket_csid == tls->cipher_suite->id) &&
                     ((((ticket_negotiated_protocol.len == 0 ||
                        ((tls->negotiated_protocol != (char *)0x0 &&
                         (x_00.len = ticket_negotiated_protocol.len,
                         x_00.base = ticket_negotiated_protocol.base,
                         iVar21 = vec_is_string(x_00,tls->negotiated_protocol), iVar21 != 0)))) &&
                       (ppVar29 = tls->key_schedule,
                       sStack_b00 == (ppVar29->hashes[0].algo)->digest_size)) &&
                      (paVar58->list[uVar31].binder.len == sStack_b00)))) goto LAB_0011aeed;
                }
              }
              else if ((ticket_ctx.len == 0x20) &&
                      (iVar21 = bcmp((void *)CONCAT71(ticket_ctx.base._1_7_,ticket_ctx.base._0_1_),
                                     &ppVar47->ticket_context,0x20), iVar21 == 0))
              goto LAB_0011a611;
            }
          }
        }
        else if ((ppVar43->len == (ppVar47->pre_shared_key).identity.len) &&
                (iVar21 = bcmp(ppVar43->base,puVar41,ppVar43->len), iVar21 == 0)) {
          bVar20 = (bool)(uVar31 == 0 & (ch->psk).field_0xb4);
          tls->key_share = (ptls_key_exchange_algorithm_t *)0x0;
          puVar41 = (ppVar47->pre_shared_key).secret.base;
          sStack_b00 = (ppVar47->pre_shared_key).secret.len;
          group = (uint16_t)puVar41;
          uStack_b06 = (undefined6)((ulong)puVar41 >> 0x10);
          ppVar29 = tls->key_schedule;
LAB_0011aeed:
          if ((char)local_b70 != '\0') {
            ikm_00.base._2_6_ = uStack_b06;
            ikm_00.base._0_2_ = group;
            ikm_00.len = sStack_b00;
            iVar21 = key_schedule_extract(ppVar29,ikm_00);
            if (iVar21 != 0) goto LAB_0011af83;
            ppVar47 = tls->ctx;
            ppVar29 = tls->key_schedule;
          }
          pcVar39 = "ext binder";
          if ((ppVar47->pre_shared_key).secret.base == (uint8_t *)0x0) {
            pcVar39 = "res binder";
          }
          iVar21 = derive_secret_with_empty_digest(ppVar29,sig,pcVar39);
          if (iVar21 == 0) {
            ptls__key_schedule_update_hash
                      (tls->key_schedule,(uint8_t *)local_b88,(size_t)local_b78,0);
            iVar21 = calc_verify_data(sig,tls->key_schedule,sig);
            if (iVar21 == 0) {
              iVar23 = (*ptls_mem_equal)(local_b40->list[uVar31].binder.base,sig,
                                         (tls->key_schedule->hashes[0].algo)->digest_size);
              iVar21 = 0;
              if (iVar23 == 0) {
                iVar21 = 0x33;
              }
            }
          }
          goto LAB_0011af83;
        }
LAB_0011a524:
      }
      tls->key_share = (ptls_key_exchange_algorithm_t *)0x0;
      bVar20 = false;
      uVar31 = 0xffffffffffffffff;
      iVar21 = 0;
LAB_0011af83:
      ptls_buffer_dispose(&local_a80);
      (*ptls_clear_memory)(sig,0x40);
      if (iVar21 != 0) goto LAB_00119ada;
    }
  }
  if ((uVar31 == 0xffffffffffffffff) && ((tls->ctx->pre_shared_key).identity.base != (uint8_t *)0x0)
     ) {
    iVar21 = 0x73;
    goto LAB_00119ada;
  }
  if ((uVar31 == 0xffffffffffffffff) || ((tls->ctx->field_0xb8 & 8) != 0)) {
    local_b78 = (ptls_t *)0x0;
    ptls__key_schedule_update_hash(tls->key_schedule,(uint8_t *)local_b88,(size_t)local_b58,0);
    if ((char)local_b70 != '\0') {
      if (tls->key_schedule->generation != 0) {
        __assert_fail("tls->key_schedule->generation == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                      ,0x1243,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
    }
    if (local_b68 != (ptls_handshake_properties_t *)0x0) {
      ppVar43 = (ptls_iovec_t *)0x0;
      goto LAB_0011ac49;
    }
  }
  else {
    puVar41 = (ch->psk).hash_end;
    ptls__key_schedule_update_hash
              (tls->key_schedule,puVar41,
               (size_t)(local_b88->inner_client_random + (long)(local_b58 + (-0x20 - (long)puVar41))
                       ),0);
    uVar4 = (ch->psk).ke_modes;
    if ((uVar4 & 1) == 0) {
      if ((uVar4 & 2) == 0) {
        __assert_fail("(ch->psk.ke_modes & (1u << PTLS_PSK_KE_MODE_PSK_DHE)) != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                      ,0x124e,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      puStackY_c00 = (ushort *)0x2;
    }
    else {
      puStackY_c00 = (ushort *)0x1;
    }
    local_b78 = (ptls_t *)puStackY_c00;
    tls->field_0x1e8 = tls->field_0x1e8 | 2;
    if (local_b68 != (ptls_handshake_properties_t *)0x0) {
      ppVar43 = (ptls_iovec_t *)(ch->psk).identities.list[uVar31].binder.len;
      memcpy(local_b68,(ch->psk).identities.list[uVar31].binder.base,(size_t)ppVar43);
LAB_0011ac49:
      (local_b68->field_0).client.ech.retry_configs = ppVar43;
    }
  }
  if (((ch->psk).ke_modes == 0) || (ppVar47 = tls->ctx, ppVar47->ticket_lifetime == 0)) {
    bVar35 = 0;
LAB_0011acc6:
    (tls->field_19).server.num_tickets_to_send = bVar35;
  }
  else {
    bVar19 = (ch->ticket_request).new_session_count;
    if (bVar19 == 0) {
      bVar19 = 1;
    }
    else if ((tls->field_0x1e8 & 2) != 0) {
      bVar19 = (ch->ticket_request).resumption_count;
    }
    (tls->field_19).server.num_tickets_to_send = bVar19;
    bVar3 = (ppVar47->ticket_requests).server.max_count;
    bVar35 = 4;
    if (bVar3 != 0) {
      bVar35 = bVar3;
    }
    if (bVar35 < bVar19) goto LAB_0011acc6;
  }
  if (((bVar20 != false) && (uVar31 == 0)) && (tls->ctx->max_early_data_size != 0)) {
    puVar41 = (uint8_t *)malloc(0x40);
    tls->pending_handshake_secret = puVar41;
    iVar21 = 0x201;
    if (((puVar41 == (uint8_t *)0x0) || (iVar21 = derive_exporter_secret(tls,1), iVar21 != 0)) ||
       (iVar21 = setup_traffic_protection(tls,0,"c e traffic",1,0,0), iVar21 != 0))
    goto LAB_00119ada;
  }
  if ((int)local_b78 != 1) {
    if (local_b80 == (st_ptls_key_exchange_algorithm_t *)0x0) {
      iVar21 = 0x28;
      if ((ch->key_shares).base == (uint8_t *)0x0) {
        iVar21 = 0x6d;
      }
      goto LAB_00119ada;
    }
    pVar16.len._0_4_ = local_b48;
    pVar16.base = local_b50;
    pVar16.len._4_4_ = uStack_b44;
    iVar21 = (*local_b80->exchange)(local_b80,&pubkey,&ecdh_secret,pVar16);
    if (iVar21 != 0) {
      if (pubkey.base != (uint8_t *)0x0) {
        __assert_fail("pubkey.base == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                      ,0x127c,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      if (ecdh_secret.base != (uint8_t *)0x0) {
        __assert_fail("ecdh_secret.base == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                      ,0x127d,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      goto LAB_00119ada;
    }
    tls->key_share = local_b80;
  }
  iVar21 = (*emitter->begin_message)(emitter);
  if (iVar21 != 0) goto LAB_00119ada;
  ppVar45 = emitter->buf;
  local_b32[4] = 2;
  iVar21 = ptls_buffer__do_pushv(ppVar45,local_b32 + 4,1);
  if ((iVar21 != 0) || (iVar21 = ptls_buffer__do_pushv(ppVar45,"",3), iVar21 != 0))
  goto LAB_00119ada;
  sVar27 = ppVar45->off;
  local_b70 = (ptls_key_schedule_t *)emitter->buf->off;
  local_ab8[0] = 0x303;
  iVar21 = ptls_buffer__do_pushv(emitter->buf,local_ab8,2);
  if ((iVar21 != 0) || (iVar21 = ptls_buffer_reserve(emitter->buf,0x20), iVar21 != 0))
  goto LAB_00119ada;
  (*tls->ctx->random_bytes)(emitter->buf->base + emitter->buf->off,0x20);
  if ((undefined1  [112])((undefined1  [112])tls->ech & (undefined1  [112])0x4) ==
      (undefined1  [112])0x0) {
    lVar34 = 0;
  }
  else {
    sVar59 = emitter->buf->off;
    puVar41 = emitter->buf->base + sVar59 + 0x18;
    puVar41[0] = '\0';
    puVar41[1] = '\0';
    puVar41[2] = '\0';
    puVar41[3] = '\0';
    puVar41[4] = '\0';
    puVar41[5] = '\0';
    puVar41[6] = '\0';
    puVar41[7] = '\0';
    lVar34 = sVar59 + 0x18;
  }
  ppVar55 = emitter->buf;
  psVar1 = &ppVar55->off;
  *psVar1 = *psVar1 + 0x20;
  iVar21 = ptls_buffer__do_pushv(ppVar55,"",1);
  if (iVar21 != 0) goto LAB_00119ada;
  sVar59 = emitter->buf->off;
  iVar21 = ptls_buffer__do_pushv
                     (emitter->buf,(ch->legacy_session_id).base,(ch->legacy_session_id).len);
  if (iVar21 != 0) goto LAB_00119ada;
  uVar32 = emitter->buf->off - sVar59;
  if (0xff < uVar32) goto LAB_0011b4c3;
  emitter->buf->base[sVar59 - 1] = (uint8_t)uVar32;
  uVar38 = tls->cipher_suite->id;
  local_abe[2] = uVar38 << 8 | uVar38 >> 8;
  iVar21 = ptls_buffer__do_pushv(emitter->buf,local_abe + 2,2);
  if (iVar21 != 0) goto LAB_00119ada;
  local_b32[3] = 0;
  iVar21 = ptls_buffer__do_pushv(emitter->buf,local_b32 + 3,1);
  if ((iVar21 != 0) || (iVar21 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar21 != 0))
  goto LAB_00119ada;
  sVar59 = emitter->buf->off;
  local_abe[1] = 0x2b00;
  iVar21 = ptls_buffer__do_pushv(emitter->buf,local_abe + 1,2);
  if ((iVar21 != 0) || (iVar21 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar21 != 0))
  goto LAB_00119ada;
  sVar48 = emitter->buf->off;
  local_abe[0] = ch->selected_version << 8 | ch->selected_version >> 8;
  iVar21 = ptls_buffer__do_pushv(emitter->buf,local_abe,2);
  if (iVar21 != 0) goto LAB_00119ada;
  uVar32 = emitter->buf->off - sVar48;
  if (uVar32 < 0x10000) {
    local_b70 = (ptls_key_schedule_t *)((long)&local_b70[-1].hashes[0].ctx_outer + 4);
    local_b88 = &tls->ech;
    for (lVar37 = 8; lVar37 != -8; lVar37 = lVar37 + -8) {
      emitter->buf->base[sVar48 - 2] = (uint8_t)(uVar32 >> ((byte)lVar37 & 0x3f));
      sVar48 = sVar48 + 1;
    }
    ppVar55 = emitter->buf;
    if ((int)local_b78 == 1) {
LAB_0011bb24:
      local_ac6[1] = 0x2900;
      iVar21 = ptls_buffer__do_pushv(ppVar55,local_ac6 + 1,2);
      if ((iVar21 != 0) || (iVar21 = ptls_buffer__do_pushv(ppVar55,"",2), iVar21 != 0))
      goto LAB_00119ada;
      local_b80 = (ptls_key_exchange_algorithm_t *)ppVar55->off;
      local_ac6[0] = (ushort)uVar31 << 8 | (ushort)uVar31 >> 8;
      iVar21 = ptls_buffer__do_pushv(ppVar55,local_ac6,2);
      if (iVar21 != 0) goto LAB_00119ada;
      uVar31 = ppVar55->off - (long)local_b80;
      if (uVar31 < 0x10000) {
        (ppVar55->base + -2)[(long)local_b80] = (uint8_t)(uVar31 >> 8);
        (ppVar55->base + -1)[(long)local_b80] = (uint8_t)uVar31;
LAB_0011bbb5:
        uVar31 = emitter->buf->off - sVar59;
        if (uVar31 < 0x10000) {
          for (lVar37 = 8; lVar37 != -8; lVar37 = lVar37 + -8) {
            emitter->buf->base[sVar59 - 2] = (uint8_t)(uVar31 >> ((byte)lVar37 & 0x3f));
            sVar59 = sVar59 + 1;
          }
          uVar31 = ppVar45->off - sVar27;
          if (uVar31 < 0x1000000) {
            for (lVar37 = 0x10; lVar37 != -8; lVar37 = lVar37 + -8) {
              ppVar45->base[sVar27 - 3] = (uint8_t)(uVar31 >> ((byte)lVar37 & 0x3f));
              sVar27 = sVar27 + 1;
            }
            iVar21 = (*emitter->commit_message)(emitter);
            if ((iVar21 != 0) ||
               ((lVar34 != 0 &&
                (puVar41 = emitter->buf->base,
                message_01.base = local_b70->secret + (long)(puVar41 + -4),
                message_01.len = emitter->buf->off - (long)local_b70,
                iVar21 = ech_calc_confirmation
                                   (tls->key_schedule,puVar41 + lVar34,
                                    (tls->ech).inner_client_random,"ech accept confirmation",
                                    message_01), iVar21 != 0)))) goto LAB_00119ada;
            ptls__key_schedule_update_hash
                      (tls->key_schedule,local_b70->secret + (long)(emitter->buf->base + -4),
                       emitter->buf->off - (long)local_b70,0);
            clear_ech(local_b88,1);
            iVar21 = push_change_cipher_spec(tls,emitter);
            if (iVar21 != 0) goto LAB_00119ada;
            if (tls->key_schedule->generation != 1) {
              __assert_fail("tls->key_schedule->generation == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                            ,0x12ad,
                            "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                           );
            }
            ikm.len = ecdh_secret.len;
            ikm.base = ecdh_secret.base;
            key_schedule_extract(tls->key_schedule,ikm);
            iVar21 = setup_traffic_protection(tls,1,"s hs traffic",2,0,0);
            if (iVar21 != 0) goto LAB_00119ada;
            if (tls->pending_handshake_secret == (uint8_t *)0x0) {
              iVar21 = setup_traffic_protection(tls,0,"c hs traffic",2,0,0);
              if (iVar21 != 0) goto LAB_00119ada;
              if (((ch->psk).field_0xb4 & 1) != 0) {
                (tls->field_19).server.early_data_skipped_bytes = 0;
              }
            }
            else {
              iVar21 = derive_secret(tls->key_schedule,tls->pending_handshake_secret,"c hs traffic")
              ;
              if ((iVar21 != 0) ||
                 ((psVar13 = tls->ctx->update_traffic_key,
                  psVar13 != (st_ptls_update_traffic_key_t *)0x0 &&
                  (iVar21 = (*psVar13->cb)(psVar13,tls,0,2,tls->pending_handshake_secret),
                  iVar21 != 0)))) goto LAB_00119ada;
            }
            iVar21 = (*emitter->begin_message)(emitter);
            if (iVar21 != 0) goto LAB_00119ada;
            ppVar45 = emitter->buf;
            local_b70 = tls->key_schedule;
            local_b80 = (ptls_key_exchange_algorithm_t *)ppVar45->off;
            local_b32[2] = 8;
            iVar21 = ptls_buffer__do_pushv(ppVar45,local_b32 + 2,1);
            if ((iVar21 != 0) || (iVar21 = ptls_buffer__do_pushv(ppVar45,"",3), iVar21 != 0))
            goto LAB_00119ada;
            local_b50 = (uint8_t *)ppVar45->off;
            ppVar55 = emitter->buf;
            iVar21 = ptls_buffer__do_pushv(ppVar55,"",2);
            if (iVar21 != 0) goto LAB_00119ada;
            local_b58 = (uint8_t *)ppVar55->off;
            if (tls->server_name != (char *)0x0) {
              local_ac8 = 0;
              iVar21 = ptls_buffer__do_pushv(ppVar55,&local_ac8,2);
              if ((iVar21 != 0) || (iVar21 = ptls_buffer__do_pushv(ppVar55,"",2), iVar21 != 0))
              goto LAB_00119ada;
              sVar27 = ppVar55->off;
              for (lVar34 = -2; lVar34 != 0; lVar34 = lVar34 + 1) {
                ppVar55->base[lVar34 + sVar27] = '\0';
              }
            }
            if ((tls->ctx->field_0xb8 & 0x20) != 0) {
              local_aca = 0x1400;
              iVar21 = ptls_buffer__do_pushv(ppVar55,&local_aca,2);
              if ((iVar21 != 0) || (iVar21 = ptls_buffer__do_pushv(ppVar55,"",2), iVar21 != 0))
              goto LAB_00119ada;
              sVar27 = ppVar55->off;
              local_b32[1] = 2;
              iVar21 = ptls_buffer__do_pushv(ppVar55,local_b32 + 1,1);
              if (iVar21 != 0) goto LAB_00119ada;
              uVar31 = ppVar55->off - sVar27;
              if (0xffff < uVar31) goto LAB_0011b4c3;
              ppVar55->base[sVar27 - 2] = (uint8_t)(uVar31 >> 8);
              ppVar55->base[sVar27 - 1] = (uint8_t)uVar31;
            }
            if (tls->negotiated_protocol == (char *)0x0) {
LAB_0011cc6f:
              if (tls->pending_handshake_secret != (uint8_t *)0x0) {
                local_ace = 0x2a00;
                iVar21 = ptls_buffer__do_pushv(ppVar55,&local_ace,2);
                if ((iVar21 != 0) || (iVar21 = ptls_buffer__do_pushv(ppVar55,"",2), iVar21 != 0))
                goto LAB_00119ada;
                sVar27 = ppVar55->off;
                for (lVar34 = -2; lVar34 != 0; lVar34 = lVar34 + 1) {
                  ppVar55->base[lVar34 + sVar27] = '\0';
                }
              }
              if ((((undefined1  [112])((undefined1  [112])*local_b88 & (undefined1  [112])0x5) ==
                    (undefined1  [112])0x1) &&
                  ((tls->ctx->ech).server.create_opener != (ptls_ech_create_opener_t *)0x0)) &&
                 ((tls->ctx->ech).server.retry_configs.len != 0)) {
                local_ad0 = 0xdfe;
                iVar21 = ptls_buffer__do_pushv(ppVar55,&local_ad0,2);
                if ((iVar21 != 0) || (iVar21 = ptls_buffer__do_pushv(ppVar55,"",2), iVar21 != 0))
                goto LAB_00119ada;
                sVar27 = ppVar55->off;
                iVar21 = ptls_buffer__do_pushv
                                   (ppVar55,(tls->ctx->ech).server.retry_configs.base,
                                    (tls->ctx->ech).server.retry_configs.len);
                if (iVar21 != 0) goto LAB_00119ada;
                uVar31 = ppVar55->off - sVar27;
                if (0xffff < uVar31) goto LAB_0011b4c3;
                ppVar55->base[sVar27 - 2] = (uint8_t)(uVar31 >> 8);
                ppVar55->base[sVar27 - 1] = (uint8_t)uVar31;
              }
              if (((ch->ticket_request).new_session_count != '\0') &&
                 ((tls->field_19).server.num_tickets_to_send != '\0')) {
                local_ad2 = 0x3a00;
                iVar21 = ptls_buffer__do_pushv(ppVar55,&local_ad2,2);
                if ((iVar21 != 0) || (iVar21 = ptls_buffer__do_pushv(ppVar55,"",2), iVar21 != 0))
                goto LAB_00119ada;
                sVar27 = ppVar55->off;
                local_b32[0] = (tls->field_19).server.num_tickets_to_send;
                iVar21 = ptls_buffer__do_pushv(ppVar55,local_b32,1);
                if (iVar21 != 0) goto LAB_00119ada;
                uVar31 = ppVar55->off - sVar27;
                if (0xffff < uVar31) goto LAB_0011b4c3;
                ppVar55->base[sVar27 - 2] = (uint8_t)(uVar31 >> 8);
                ppVar55->base[sVar27 - 1] = (uint8_t)uVar31;
              }
              iVar21 = push_additional_extensions(local_b68,ppVar55);
              if (iVar21 != 0) goto LAB_00119ada;
              uVar31 = ppVar55->off - (long)local_b58;
              if (uVar31 < 0x10000) {
                local_b58[(long)(ppVar55->base + -2)] = (uint8_t)(uVar31 >> 8);
                local_b58[(long)(ppVar55->base + -1)] = (uint8_t)uVar31;
                uVar31 = ppVar45->off - (long)local_b50;
                if (uVar31 < 0x1000000) {
                  for (lVar34 = 0x10; lVar34 != -8; lVar34 = lVar34 + -8) {
                    local_b50[(long)(ppVar45->base + -3)] =
                         (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                    local_b50 = local_b50 + 1;
                  }
                  if (local_b70 != (ptls_key_schedule_t *)0x0) {
                    ptls__key_schedule_update_hash
                              (local_b70,(uint8_t *)((long)&local_b80->id + (long)ppVar45->base),
                               ppVar45->off - (long)local_b80,0);
                  }
                  iVar21 = (*emitter->commit_message)(emitter);
                  if (iVar21 != 0) goto LAB_00119ada;
                  if ((int)local_b78 == 0) {
                    if ((tls->ctx->field_0xb8 & 8) != 0) {
                      iVar21 = (*emitter->begin_message)(emitter);
                      if (iVar21 != 0) goto LAB_00119ada;
                      local_b68 = (ptls_handshake_properties_t *)emitter->buf;
                      local_b88 = (st_ptls_ech_t *)tls->key_schedule;
                      local_b50 = (local_b68->field_0).client.session_ticket.base;
                      local_b33 = 0xd;
                      iVar21 = ptls_buffer__do_pushv((ptls_buffer_t *)local_b68,&local_b33,1);
                      if ((iVar21 != 0) ||
                         (iVar21 = ptls_buffer__do_pushv((ptls_buffer_t *)local_b68,"",3),
                         iVar21 != 0)) goto LAB_00119ada;
                      local_b70 = (ptls_key_schedule_t *)
                                  (local_b68->field_0).client.session_ticket.base;
                      ppVar45 = emitter->buf;
                      local_b34 = 0;
                      iVar21 = ptls_buffer__do_pushv(ppVar45,&local_b34,1);
                      if ((iVar21 != 0) ||
                         (iVar21 = ptls_buffer__do_pushv(ppVar45,"",2), iVar21 != 0))
                      goto LAB_00119ada;
                      local_b80 = (ptls_key_exchange_algorithm_t *)ppVar45->off;
                      local_ad4 = 0xd00;
                      iVar21 = ptls_buffer__do_pushv(ppVar45,&local_ad4,2);
                      if ((iVar21 != 0) ||
                         (iVar21 = ptls_buffer__do_pushv(ppVar45,"",2), iVar21 != 0))
                      goto LAB_00119ada;
                      sVar27 = ppVar45->off;
                      iVar21 = push_signature_algorithms(tls->ctx->verify_certificate,ppVar45);
                      if (iVar21 != 0) goto LAB_00119ada;
                      uVar31 = ppVar45->off - sVar27;
                      if (uVar31 < 0x10000) {
                        ppVar45->base[sVar27 - 2] = (uint8_t)(uVar31 >> 8);
                        ppVar45->base[sVar27 - 1] = (uint8_t)uVar31;
                        if ((tls->ctx->client_ca_names).count == 0) {
LAB_0011d1d5:
                          uVar31 = ppVar45->off - (long)local_b80;
                          if (uVar31 < 0x10000) {
                            (ppVar45->base + -2)[(long)local_b80] = (uint8_t)(uVar31 >> 8);
                            (ppVar45->base + -1)[(long)local_b80] = (uint8_t)uVar31;
                            uVar31 = (long)(local_b68->field_0).client.session_ticket.base -
                                     (long)local_b70;
                            iVar21 = 0x20c;
                            if (0xffffff < uVar31) goto LAB_00119ada;
                            for (lVar34 = 0x10; lVar34 != -8; lVar34 = lVar34 + -8) {
                              local_b70->secret
                              [(long)((long)&(local_b68->field_0).client.negotiated_protocols.list
                                             [-1].len + 1)] =
                                   (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                              local_b70 = (ptls_key_schedule_t *)((long)&local_b70->generation + 1);
                            }
                            if (local_b88 != (st_ptls_ech_t *)0x0) {
                              ptls__key_schedule_update_hash
                                        ((ptls_key_schedule_t *)local_b88,
                                         local_b50 + *(long *)&local_b68->field_0,
                                         (long)(local_b68->field_0).client.session_ticket.base -
                                         (long)local_b50,0);
                            }
                            iVar21 = (*emitter->commit_message)(emitter);
                            if (iVar21 != 0) goto LAB_00119ada;
                            goto LAB_0011d2a2;
                          }
                        }
                        else {
                          local_ad6 = 0x2f00;
                          iVar21 = ptls_buffer__do_pushv(ppVar45,&local_ad6,2);
                          if ((iVar21 != 0) ||
                             (iVar21 = ptls_buffer__do_pushv(ppVar45,"",2), iVar21 != 0))
                          goto LAB_00119ada;
                          sVar27 = ppVar45->off;
                          iVar21 = ptls_buffer__do_pushv(ppVar45,"",2);
                          if (iVar21 != 0) goto LAB_00119ada;
                          sVar59 = ppVar45->off;
                          lVar34 = 8;
                          for (sVar48 = 0; sVar48 != (tls->ctx->client_ca_names).count;
                              sVar48 = sVar48 + 1) {
                            iVar21 = ptls_buffer__do_pushv(ppVar45,"",2);
                            if (iVar21 != 0) goto LAB_00119ada;
                            sVar60 = ppVar45->off;
                            ppVar43 = (tls->ctx->client_ca_names).list;
                            iVar21 = ptls_buffer__do_pushv
                                               (ppVar45,*(void **)((long)ppVar43 + lVar34 + -8),
                                                *(size_t *)((long)&ppVar43->base + lVar34));
                            if (iVar21 != 0) goto LAB_00119ada;
                            uVar31 = ppVar45->off - sVar60;
                            if (0xffff < uVar31) goto LAB_0011b4c3;
                            ppVar45->base[sVar60 - 2] = (uint8_t)(uVar31 >> 8);
                            ppVar45->base[sVar60 - 1] = (uint8_t)uVar31;
                            lVar34 = lVar34 + 0x10;
                          }
                          uVar31 = ppVar45->off - sVar59;
                          if (uVar31 < 0x10000) {
                            ppVar45->base[sVar59 - 2] = (uint8_t)(uVar31 >> 8);
                            ppVar45->base[sVar59 - 1] = (uint8_t)uVar31;
                            uVar31 = ppVar45->off - sVar27;
                            if (uVar31 < 0x10000) {
                              ppVar45->base[sVar27 - 2] = (uint8_t)(uVar31 >> 8);
                              ppVar45->base[sVar27 - 1] = (uint8_t)uVar31;
                              goto LAB_0011d1d5;
                            }
                          }
                        }
                      }
                      goto LAB_0011b4c3;
                    }
LAB_0011d2a2:
                    signature_algorithms = &ch->signature_algorithms;
                    iVar21 = send_certificate(tls,emitter,signature_algorithms,
                                              (ptls_iovec_t)ZEXT816(0),(byte)ch->field_0x228 & 1,
                                              (ch->cert_compression_algos).list,
                                              (ch->cert_compression_algos).count);
                    if (iVar21 != 0) goto LAB_00119ada;
                    iVar21 = 1;
                  }
                  else {
                    iVar21 = 0;
                    signature_algorithms = (st_ptls_signature_algorithms_t *)0x0;
                  }
                  iVar21 = server_finish_handshake(tls,emitter,iVar21,signature_algorithms);
                  goto LAB_00119ada;
                }
              }
            }
            else {
              local_acc = 0x1000;
              iVar21 = ptls_buffer__do_pushv(ppVar55,&local_acc,2);
              if ((iVar21 != 0) || (iVar21 = ptls_buffer__do_pushv(ppVar55,"",2), iVar21 != 0))
              goto LAB_00119ada;
              sVar27 = ppVar55->off;
              iVar21 = ptls_buffer__do_pushv(ppVar55,"",2);
              if (iVar21 != 0) goto LAB_00119ada;
              sVar59 = ppVar55->off;
              iVar21 = ptls_buffer__do_pushv(ppVar55,"",1);
              if (iVar21 != 0) goto LAB_00119ada;
              sVar48 = ppVar55->off;
              pcVar39 = tls->negotiated_protocol;
              sVar28 = strlen(pcVar39);
              iVar21 = ptls_buffer__do_pushv(ppVar55,pcVar39,sVar28);
              if (iVar21 != 0) goto LAB_00119ada;
              uVar31 = ppVar55->off - sVar48;
              if (uVar31 < 0x100) {
                ppVar55->base[sVar48 - 1] = (uint8_t)uVar31;
                uVar31 = ppVar55->off - sVar59;
                if (uVar31 < 0x10000) {
                  ppVar55->base[sVar59 - 2] = (uint8_t)(uVar31 >> 8);
                  ppVar55->base[sVar59 - 1] = (uint8_t)uVar31;
                  uVar31 = ppVar55->off - sVar27;
                  if (uVar31 < 0x10000) {
                    ppVar55->base[sVar27 - 2] = (uint8_t)(uVar31 >> 8);
                    ppVar55->base[sVar27 - 1] = (uint8_t)uVar31;
                    goto LAB_0011cc6f;
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      local_ac0 = 0x3300;
      iVar21 = ptls_buffer__do_pushv(ppVar55,&local_ac0,2);
      if ((iVar21 != 0) || (iVar21 = ptls_buffer__do_pushv(ppVar55,"",2), iVar21 != 0))
      goto LAB_00119ada;
      local_b50 = (uint8_t *)ppVar55->off;
      local_ac6[2] = local_b80->id << 8 | local_b80->id >> 8;
      iVar21 = ptls_buffer__do_pushv(ppVar55,local_ac6 + 2,2);
      if ((iVar21 != 0) || (iVar21 = ptls_buffer__do_pushv(ppVar55,"",2), iVar21 != 0))
      goto LAB_00119ada;
      local_b80 = (ptls_key_exchange_algorithm_t *)ppVar55->off;
      iVar21 = ptls_buffer__do_pushv(ppVar55,pubkey.base,pubkey.len);
      if (iVar21 != 0) goto LAB_00119ada;
      uVar32 = ppVar55->off - (long)local_b80;
      if (uVar32 < 0x10000) {
        (ppVar55->base + -2)[(long)local_b80] = (uint8_t)(uVar32 >> 8);
        (ppVar55->base + -1)[(long)local_b80] = (uint8_t)uVar32;
        uVar32 = ppVar55->off - (long)local_b50;
        if (uVar32 < 0x10000) {
          local_b50[(long)(ppVar55->base + -2)] = (uint8_t)(uVar32 >> 8);
          local_b50[(long)(ppVar55->base + -1)] = (uint8_t)uVar32;
          if ((int)local_b78 != 0) goto LAB_0011bb24;
          goto LAB_0011bbb5;
        }
      }
    }
  }
LAB_0011b4c3:
  iVar21 = 0x20c;
LAB_00119ada:
  free(pubkey.base);
  if (ecdh_secret.base != (uint8_t *)0x0) {
    (*ptls_clear_memory)(ecdh_secret.base,ecdh_secret.len);
    free(ecdh_secret.base);
  }
  free(local_bb8);
  free(pvStack_bb0);
  ptls_buffer_dispose(&local_ba8);
  free(ch);
  return iVar21;
}

Assistant:

static int server_handle_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                               ptls_handshake_properties_t *properties)
{
#define EMIT_SERVER_HELLO(sched, fill_rand, extensions, post_action)                                                               \
    do {                                                                                                                           \
        size_t sh_start_off;                                                                                                       \
        ptls_push_message(emitter, NULL, PTLS_HANDSHAKE_TYPE_SERVER_HELLO, {                                                       \
            sh_start_off = emitter->buf->off - PTLS_HANDSHAKE_HEADER_SIZE;                                                         \
            ptls_buffer_push16(emitter->buf, 0x0303 /* legacy version */);                                                         \
            if ((ret = ptls_buffer_reserve(emitter->buf, PTLS_HELLO_RANDOM_SIZE)) != 0)                                            \
                goto Exit;                                                                                                         \
            do {                                                                                                                   \
                fill_rand                                                                                                          \
            } while (0);                                                                                                           \
            emitter->buf->off += PTLS_HELLO_RANDOM_SIZE;                                                                           \
            ptls_buffer_push_block(emitter->buf, 1,                                                                                \
                                   { ptls_buffer_pushv(emitter->buf, ch->legacy_session_id.base, ch->legacy_session_id.len); });   \
            ptls_buffer_push16(emitter->buf, tls->cipher_suite->id);                                                               \
            ptls_buffer_push(emitter->buf, 0);                                                                                     \
            ptls_buffer_push_block(emitter->buf, 2, {                                                                              \
                buffer_push_extension(emitter->buf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS,                                        \
                                      { ptls_buffer_push16(emitter->buf, ch->selected_version); });                                \
                do {                                                                                                               \
                    extensions                                                                                                     \
                } while (0);                                                                                                       \
            });                                                                                                                    \
        }